

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SimpleDirectiveSyntax,slang::syntax::SimpleDirectiveSyntax_const&>
          (BumpAllocator *this,SimpleDirectiveSyntax *args)

{
  SimpleDirectiveSyntax *__dest;
  void *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  __dest = (SimpleDirectiveSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  memcpy(__dest,in_RSI,0x28);
  return __dest;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }